

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
TasGrid::GridSequence::cacheBasisValues<double>
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,GridSequence *this,double *x)

{
  double dVar1;
  int iVar2;
  undefined8 *puVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer piVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  allocator_type local_31;
  
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)__return_storage_ptr__,(long)(this->super_BaseCanonicalGrid).num_dimensions,&local_31)
  ;
  if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
    pvVar5 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      ::std::vector<double,_std::allocator<double>_>::resize(pvVar5 + lVar9,(long)piVar6[lVar9] + 1)
      ;
      dVar1 = x[lVar9];
      pvVar5 = (__return_storage_ptr__->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar3 = pvVar5[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *puVar3 = 0x3ff0000000000000;
      piVar6 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar6[lVar9];
      if (0 < (long)iVar2) {
        pdVar4 = (this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar7 = 0;
        dVar10 = 1.0;
        do {
          dVar10 = dVar10 * (dVar1 - pdVar4[lVar7]);
          puVar3[lVar7 + 1] = dVar10;
          lVar7 = lVar7 + 1;
        } while (iVar2 != lVar7);
        pdVar4 = (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = 1;
        do {
          puVar3[uVar8] = (double)puVar3[uVar8] / pdVar4[uVar8];
          uVar8 = uVar8 + 1;
        } while (iVar2 + 1 != uVar8);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_BaseCanonicalGrid).num_dimensions);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T>> cacheBasisValues(const T x[]) const{
        std::vector<std::vector<T>> cache(num_dimensions);
        for(int j=0; j<num_dimensions; j++){
            cache[j].resize(max_levels[j] + 1);
            T b = 1.0;
            T this_x = x[j];
            cache[j][0] = b;
            for(int i=0; i<max_levels[j]; i++){
                b *= (this_x - nodes[i]);
                cache[j][i+1] = b;
            }
            for(int i=1; i<=max_levels[j]; i++){
                cache[j][i] /= coeff[i];
            }
        }
        return cache;
    }